

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void __thiscall
amrex::AmrMesh::MakeNewGrids
          (AmrMesh *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  Box *pBVar1;
  IntVect *pIVar2;
  Real eff;
  byte bVar3;
  pointer pGVar4;
  pointer pBVar5;
  long *plVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  BoxList *rhs;
  pointer pIVar13;
  int iVar14;
  uint uVar15;
  pointer pIVar16;
  pointer pIVar17;
  long lVar18;
  int n_1;
  ulong uVar19;
  long lVar20;
  int n;
  long lVar21;
  long lVar22;
  int dir;
  long lVar23;
  long lVar24;
  long local_450;
  long local_438;
  IntVect ngt;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> bf_lev;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_comp_ba;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> pc_domain;
  BoxList new_bx;
  PinnedVector<IntVect> tagvec;
  BoxList p_n_comp;
  BoxList p_n;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_ba;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> rr_lev;
  BoxList bl;
  Box result;
  ClusterList clist;
  BoxArray ba_proj;
  
  iVar14 = (this->super_AmrInfo).max_level;
  iVar12 = *(int *)&(this->super_AmrInfo).field_0x8c;
  if (iVar14 + -1 < iVar12) {
    iVar12 = iVar14 + -1;
  }
  if (((long)(new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x68 < (long)(iVar12 + 2)) {
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              (&new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)(iVar12 + 2));
    iVar14 = (this->super_AmrInfo).max_level;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            (&bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,(long)iVar14,
             (allocator_type *)&result);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            (&rr_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,
             (long)(this->super_AmrInfo).max_level,(allocator_type *)&result);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            (&pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,
             (long)(this->super_AmrInfo).max_level,(allocator_type *)&result);
  pIVar13 = (this->super_AmrInfo).ref_ratio.
            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar16 = (this->super_AmrInfo).blocking_factor.
            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar14 = -1;
  if (-1 < iVar12) {
    iVar14 = iVar12;
  }
  pIVar17 = bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (uVar19 = 0; pIVar16 = pIVar16 + 1, uVar19 != iVar14 + 1; uVar19 = uVar19 + 1) {
    for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
      iVar9 = pIVar16->vect[lVar21] / pIVar13->vect[lVar21];
      if (iVar9 < 2) {
        iVar9 = 1;
      }
      pIVar17->vect[lVar21] = iVar9;
    }
    pIVar17 = pIVar17 + 1;
    pIVar13 = pIVar13 + 1;
  }
  lVar18 = (long)lbase;
  lVar24 = (long)iVar12;
  pIVar13 = rr_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18;
  pIVar16 = bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18;
  pIVar17 = (this->super_AmrInfo).ref_ratio.
            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18;
  for (lVar21 = lVar18; lVar21 < lVar24; lVar21 = lVar21 + 1) {
    for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
      pIVar13->vect[lVar20] =
           (pIVar16->vect[lVar20] * pIVar17->vect[lVar20]) / pIVar16[1].vect[lVar20];
    }
    pIVar13 = pIVar13 + 1;
    pIVar16 = pIVar16 + 1;
    pIVar17 = pIVar17 + 1;
  }
  pIVar13 = bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start + lVar18;
  lVar21 = lVar18;
  do {
    if (lVar24 < lVar21) {
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
                (&p_n_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                 (long)(this->super_AmrInfo).max_level,(allocator_type *)&result);
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
                (&p_n_comp_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                 (long)(this->super_AmrInfo).max_level,(allocator_type *)&result);
      BoxList::BoxList(&p_n);
      BoxList::BoxList(&p_n_comp);
      rhs = BoxArray::simplified_list
                      ((this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                       .super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar18);
      BoxList::BoxList(&bl,rhs);
      BoxList::coarsen(&bl,bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar18);
      BoxList::parallelComplementIn
                (&p_n_comp,
                 pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar18,&bl);
      BoxList::clear(&bl);
      BoxList::simplify(&p_n_comp,false);
      BoxList::accrete(&p_n_comp,(this->super_AmrInfo).n_proper);
      pGVar4 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar19 = (ulong)(byte)pGVar4[lVar18].super_CoordSys.field_0x51;
      bVar3 = pGVar4[lVar18].super_CoordSys.field_0x52;
      if (((uVar19 != 0) || ((bVar3 & 1) != 0)) ||
         (pGVar4[lVar18].super_CoordSys.field_0x53 == '\x01')) {
        result.smallend.vect._0_8_ = (ulong)bVar3 << 0x20 | uVar19;
        result.smallend.vect[2] = (int)(byte)pGVar4[lVar18].super_CoordSys.field_0x53;
        ProjPeriodic(&p_n_comp,
                     pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar18,(Array<int,_3> *)&result);
      }
      BoxArray::define(p_n_comp_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar18,&p_n_comp);
      BoxList::BoxList((BoxList *)&result);
      BoxList::operator=(&p_n_comp,(BoxList *)&result);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&result);
      BoxList::parallelComplementIn
                (&p_n,pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar18,
                 p_n_comp_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar18);
      BoxList::simplify(&p_n,false);
      BoxArray::define(p_n_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar18,&p_n);
      BoxList::BoxList((BoxList *)&result);
      BoxList::operator=(&p_n,(BoxList *)&result);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&result);
      lVar23 = (long)(lbase + 1);
      lVar22 = lVar23 * 0x68;
      lVar20 = lVar23 * 0xc + -0xc;
      local_438 = lVar23 * 200 + 0x53;
      local_450 = lVar23 * 0x1c;
      for (lVar21 = lVar23; lVar21 <= lVar24; lVar21 = lVar21 + 1) {
        BoxArray::boxList((BoxList *)&result,
                          (BoxArray *)
                          ((long)&p_n_comp_ba.
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_bat.m_bat_type +
                          lVar22));
        BoxList::operator=(&p_n_comp,(BoxList *)&result);
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&result);
        BoxList::simplify(&p_n_comp,false);
        BoxList::refine(&p_n_comp,
                        (IntVect *)
                        ((long)(rr_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                .super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                ._M_impl.super__Vector_impl_data._M_start)->vect + lVar20));
        BoxList::accrete(&p_n_comp,(this->super_AmrInfo).n_proper);
        pGVar4 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar19 = (ulong)*(byte *)((long)(pGVar4->super_CoordSys).offset +
                                 local_438 + 0xfffffffffffffff6U);
        bVar3 = *(byte *)((long)(pGVar4->super_CoordSys).offset + local_438 + 0xfffffffffffffff7U);
        if (((uVar19 != 0) || ((bVar3 & 1) != 0)) ||
           (*(char *)((long)(pGVar4->super_CoordSys).offset + local_438 + -8) == '\x01')) {
          result.smallend.vect._0_8_ = (ulong)bVar3 << 0x20 | uVar19;
          result.smallend.vect[2] =
               (int)*(byte *)((long)(pGVar4->super_CoordSys).offset + local_438 + -8);
          ProjPeriodic(&p_n_comp,
                       (Box *)((long)((pc_domain.
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->smallend).vect +
                              local_450),(Array<int,_3> *)&result);
        }
        BoxArray::define((BoxArray *)
                         ((long)&((p_n_comp_ba.
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                         lVar22),&p_n_comp);
        BoxList::BoxList((BoxList *)&result);
        BoxList::operator=(&p_n_comp,(BoxList *)&result);
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&result);
        BoxList::parallelComplementIn
                  (&p_n,(Box *)((long)((pc_domain.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->smallend).vect +
                               local_450),
                   (BoxArray *)
                   ((long)&((p_n_comp_ba.
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar22))
        ;
        BoxList::simplify(&p_n,false);
        BoxArray::define((BoxArray *)
                         ((long)&((p_n_ba.
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                         lVar22),&p_n);
        BoxList::BoxList((BoxList *)&result);
        BoxList::operator=(&p_n,(BoxList *)&result);
        std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                  ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&result);
        lVar22 = lVar22 + 0x68;
        lVar20 = lVar20 + 0xc;
        local_438 = local_438 + 200;
        local_450 = local_450 + 0x1c;
      }
      *new_finest = lbase;
      local_438 = lVar24 * 0xc;
      for (; lVar18 <= lVar24; lVar24 = lVar24 + -1) {
        pIVar13 = (this->super_AmrInfo).n_error_buf.
                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ngt.vect[2] = pIVar13[lVar24].vect[2];
        ngt.vect._0_8_ = *(undefined8 *)pIVar13[lVar24].vect;
        BoxArray::BoxArray(&ba_proj);
        lVar21 = lVar24 + 1;
        if (lVar21 < *new_finest) {
          BoxArray::simplified
                    ((BoxArray *)&result,
                     (new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar24 + 2);
          BoxArray::operator=(&ba_proj,(BoxArray *)&result);
          BoxArray::~BoxArray((BoxArray *)&result);
          BoxArray::coarsen(&ba_proj,(this->super_AmrInfo).ref_ratio.
                                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar21);
          BoxArray::growcoarsen
                    (&ba_proj,(this->super_AmrInfo).n_proper,
                     (this->super_AmrInfo).ref_ratio.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar24);
          BoxArray::simplified
                    ((BoxArray *)&result,
                     (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar24);
          iVar14 = 0;
          while( true ) {
            clist.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
            _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
            clist.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
            _M_node.super__List_node_base._M_prev._0_4_ = 0;
            bVar8 = BoxArray::contains((BoxArray *)&result,&ba_proj,false,(IntVect *)&clist);
            if (bVar8) break;
            BoxArray::grow((BoxArray *)&result,1);
            iVar14 = iVar14 + 1;
          }
          if (ngt.vect[0] <= iVar14) {
            ngt.vect[0] = iVar14;
          }
          if (ngt.vect[1] <= iVar14) {
            ngt.vect[1] = iVar14;
          }
          if (iVar14 < ngt.vect[2]) {
            iVar14 = ngt.vect[2];
          }
          ngt.vect[2] = iVar14;
          BoxArray::~BoxArray((BoxArray *)&result);
        }
        TagBoxArray::TagBoxArray
                  ((TagBoxArray *)&result,
                   (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar24,
                   (this->dmap).
                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   .
                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar24,&ngt);
        if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
           ((this->super_AmrInfo).use_fixed_upto_level <= lVar24)) {
          (*this->_vptr_AmrMesh[3])(SUB84(time,0),this,lVar24,(FabArray<amrex::TagBox> *)&result);
        }
        TagBoxArray::buffer((TagBoxArray *)&result,
                            (this->super_AmrInfo).n_error_buf.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar24);
        iVar14 = (int)lVar21;
        if ((this->super_AmrInfo).use_fixed_coarse_grids == true) {
          if (lVar24 < (this->super_AmrInfo).use_fixed_upto_level) {
            iVar12 = *new_finest;
            if (*new_finest <= iVar14) {
              iVar12 = iVar14;
            }
            *new_finest = iVar12;
          }
          else {
            (*this->_vptr_AmrMesh[6])((Geometry *)&clist,this);
            TagBoxArray::setVal((TagBoxArray *)&result,(BoxArray *)&clist,CLEAR);
            BoxArray::~BoxArray((BoxArray *)&clist);
          }
        }
        iVar12 = 0;
        for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
          iVar9 = *(int *)((long)(bf_lev.
                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                          lVar20 * 4 + local_438);
          if (iVar12 <= iVar9) {
            iVar12 = iVar9;
          }
        }
        if (iVar12 < 1) {
          Abort_host("blocking factor is too small relative to ref_ratio");
        }
        else {
          TagBoxArray::coarsen
                    ((TagBoxArray *)&result,
                     bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar24);
        }
        (*this->_vptr_AmrMesh[4])(this,lVar24,(FabArray<amrex::TagBox> *)&result,&bf_lev);
        if (lVar21 < *new_finest) {
          BoxArray::coarsen(&ba_proj,bf_lev.
                                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24);
          TagBoxArray::setVal((TagBoxArray *)&result,&ba_proj,SET);
        }
        pGVar4 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar24;
        new_bx.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((ulong)(byte)(pGVar4->super_CoordSys).field_0x52 << 0x20 |
                            (ulong)(byte)(pGVar4->super_CoordSys).field_0x51);
        new_bx.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = (uint)(byte)(pGVar4->super_CoordSys).field_0x53;
        Geometry::Geometry((Geometry *)&clist,
                           pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar24,&pGVar4->prob_domain,
                           (pGVar4->super_CoordSys).c_sys,(Array<int,_3> *)&new_bx);
        TagBoxArray::mapPeriodicRemoveDuplicates((TagBoxArray *)&result,(Geometry *)&clist);
        TagBoxArray::setVal((TagBoxArray *)&result,
                            p_n_comp_ba.
                            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar24,CLEAR);
        BoxArray::clear(p_n_comp_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar24);
        tagvec.m_data = (pointer)0x0;
        tagvec.m_size = 0;
        tagvec.m_capacity = 0;
        TagBoxArray::collate((TagBoxArray *)&result,&tagvec);
        FabArray<amrex::TagBox>::clear((FabArray<amrex::TagBox> *)&result);
        if (tagvec.m_size != 0) {
          if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
             (lVar20 = (long)(this->super_AmrInfo).use_fixed_upto_level, lVar20 <= lVar24)) {
            iVar12 = *new_finest;
            if (*new_finest <= iVar14) {
              iVar12 = iVar14;
            }
            *new_finest = iVar12;
            lVar20 = (long)(this->super_AmrInfo).use_fixed_upto_level;
          }
          if (lVar20 <= lVar24) {
            BoxList::BoxList(&new_bx);
            if (*(int *)(ParallelContext::frames + 0xc) == 0) {
              ClusterList::ClusterList(&clist,tagvec.m_data,tagvec.m_size);
              eff = (this->super_AmrInfo).grid_eff;
              if ((this->super_AmrInfo).use_new_chop == true) {
                ClusterList::new_chop(&clist,eff);
              }
              else {
                ClusterList::chop(&clist,eff);
              }
              ClusterList::intersect
                        (&clist,p_n_ba.
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar24);
              ClusterList::boxList(&clist,&new_bx);
              BoxList::refine(&new_bx,bf_lev.
                                      super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar24);
              BoxList::simplify(&new_bx,false);
              if ((pointer)CONCAT44(new_bx.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (uint)new_bx.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_finish) !=
                  new_bx.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start &&
                  -1 < (long)CONCAT44(new_bx.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                      (uint)new_bx.m_lbox.
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_finish) -
                       (long)new_bx.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start) {
                BoxList::intersect(&new_bx,&(this->geom).
                                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                            .
                                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar24].domain
                                  );
              }
              ClusterList::~ClusterList(&clist);
            }
            BoxList::Bcast(&new_bx);
            BoxList::refine(&new_bx,(this->super_AmrInfo).ref_ratio.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar24);
            BoxArray::BoxArray((BoxArray *)&clist,&new_bx,
                               (this->super_AmrInfo).max_grid_size.
                               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar21);
            BoxArray::operator=((new_grids->
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar21,
                                (BoxArray *)&clist);
            BoxArray::~BoxArray((BoxArray *)&clist);
            std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                      ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&new_bx);
          }
        }
        PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~PODVector(&tagvec);
        FabArray<amrex::TagBox>::~FabArray((FabArray<amrex::TagBox> *)&result);
        BoxArray::~BoxArray(&ba_proj);
        local_438 = local_438 + -0xc;
      }
      lVar21 = lVar23 * 0x68;
      for (; lVar23 <= *new_finest; lVar23 = lVar23 + 1) {
        pBVar5 = (new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar6 = *(long **)((long)&(pBVar5->m_ref).
                                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr + lVar21);
        if (*plVar6 == plVar6[1]) {
          if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
             ((this->super_AmrInfo).use_fixed_upto_level <= lVar23)) {
            Abort_host("AmrMesh::MakeNewGrids: how did this happen?");
          }
        }
        else if ((this->super_AmrInfo).refine_grid_layout == true) {
          ChopGrids(this,(int)lVar23,(BoxArray *)((long)&(pBVar5->m_bat).m_bat_type + lVar21),
                    *(int *)(ParallelContext::frames + 0x10));
          bVar8 = BoxArray::operator==
                            ((BoxArray *)
                             ((long)&(((new_grids->
                                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ).
                                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type
                             + lVar21),
                             (BoxArray *)
                             ((long)&(((this->grids).
                                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       .
                                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type
                             + lVar21));
          if (bVar8) {
            BoxArray::operator=((BoxArray *)
                                ((long)&(((new_grids->
                                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                          ).
                                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_bat).
                                        m_bat_type + lVar21),
                                (BoxArray *)
                                ((long)&(((this->grids).
                                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                          .
                                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_bat).
                                        m_bat_type + lVar21));
          }
        }
        lVar21 = lVar21 + 0x68;
      }
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&p_n_comp);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&p_n);
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
                (&p_n_comp_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
      std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
                (&p_n_ba.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&pc_domain);
      std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
                ((_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&rr_lev);
      std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
                ((_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&bf_lev);
      return;
    }
    pGVar4 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1 = &pGVar4[lVar21].domain;
    lVar20 = *(long *)&pBVar1->smallend;
    lVar22 = *(long *)((pBVar1->smallend).vect + 2);
    pIVar2 = &pGVar4[lVar21].domain.bigend;
    lVar23 = *(long *)pIVar2->vect;
    uVar7 = *(undefined8 *)(pIVar2->vect + 2);
    result.bigend.vect[1] = (int)((ulong)lVar23 >> 0x20);
    result.bigend.vect[2] = (int)uVar7;
    result.btype.itype = SUB84(uVar7,4);
    result.smallend.vect[2] = (int)lVar22;
    result.bigend.vect[0] = (int)((ulong)lVar22 >> 0x20);
    iVar14 = bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start[lVar21].vect[0];
    iVar12 = bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start[lVar21].vect[1];
    result.smallend.vect[1] = (int)((ulong)lVar20 >> 0x20);
    uVar10 = result.smallend.vect[1];
    if (iVar12 == 1 && iVar14 == 1) {
      result.smallend.vect._0_8_ = lVar20;
      if (bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21].vect[2] != 1) goto LAB_00562f6f;
    }
    else {
      result.smallend.vect[0] = (int)lVar20;
      if (iVar14 != 1) {
        if (iVar14 == 4) {
          if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = result.smallend.vect[0] >> 2;
          }
          else {
            result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
          }
        }
        else if (iVar14 == 2) {
          if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = result.smallend.vect[0] >> 1;
          }
          else {
            result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
          }
        }
        else if (result.smallend.vect[0] < 0) {
          result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar14);
        }
        else {
          result.smallend.vect[0] = result.smallend.vect[0] / iVar14;
        }
      }
      if (iVar12 != 1) {
        if (iVar12 == 4) {
          if (lVar20 < 0) {
            uVar10 = result.smallend.vect[1] >> 2;
          }
          else {
            uVar10 = (uint)result.smallend.vect[1] >> 2;
          }
        }
        else if (iVar12 == 2) {
          if (lVar20 < 0) {
            uVar10 = result.smallend.vect[1] >> 1;
          }
          else {
            uVar10 = (uint)result.smallend.vect[1] >> 1;
          }
        }
        else if (lVar20 < 0) {
          uVar10 = ~(~result.smallend.vect[1] / iVar12);
        }
        else {
          uVar10 = result.smallend.vect[1] / iVar12;
        }
      }
LAB_00562f6f:
      result.smallend.vect[1] = uVar10;
      iVar9 = bf_lev.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21].vect[2];
      if (iVar9 != 1) {
        if (iVar9 == 4) {
          if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = result.smallend.vect[2] >> 2;
          }
          else {
            result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
          }
        }
        else if (iVar9 == 2) {
          if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = result.smallend.vect[2] >> 1;
          }
          else {
            result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
          }
        }
        else if (result.smallend.vect[2] < 0) {
          result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar9);
        }
        else {
          result.smallend.vect[2] = result.smallend.vect[2] / iVar9;
        }
      }
      result.btype.itype = SUB84(uVar7,4);
      result.bigend.vect[2] = (int)uVar7;
      if (result.btype.itype == 0) {
        uVar10 = result.bigend.vect[0];
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            uVar10 = result.bigend.vect[0] >> 2;
            if (-1 < lVar22) {
              uVar10 = (uint)result.bigend.vect[0] >> 2;
            }
          }
          else if (iVar14 == 2) {
            uVar10 = result.bigend.vect[0] >> 1;
            if (-1 < lVar22) {
              uVar10 = (uint)result.bigend.vect[0] >> 1;
            }
          }
          else if (lVar22 < 0) {
            uVar10 = ~(~result.bigend.vect[0] / iVar14);
          }
          else {
            uVar10 = result.bigend.vect[0] / iVar14;
          }
        }
        uVar15 = result.bigend.vect[1];
        if (iVar12 != 1) {
          if (iVar12 == 4) {
            uVar15 = result.bigend.vect[1] >> 2;
            if (-1 < lVar23) {
              uVar15 = (uint)result.bigend.vect[1] >> 2;
            }
          }
          else if (iVar12 == 2) {
            uVar15 = result.bigend.vect[1] >> 1;
            if (-1 < lVar23) {
              uVar15 = (uint)result.bigend.vect[1] >> 1;
            }
          }
          else if (lVar23 < 0) {
            uVar15 = ~(~result.bigend.vect[1] / iVar12);
          }
          else {
            uVar15 = result.bigend.vect[1] / iVar12;
          }
        }
        uVar11 = result.bigend.vect[2];
        result.bigend.vect[0] = uVar10;
        result.bigend.vect[1] = uVar15;
        if (iVar9 != 1) {
          if (iVar9 == 4) {
            uVar11 = result.bigend.vect[2] >> 2;
            if (-1 < result.bigend.vect[2]) {
              uVar11 = (uint)result.bigend.vect[2] >> 2;
            }
          }
          else if (iVar9 == 2) {
            uVar11 = result.bigend.vect[2] >> 1;
            if (-1 < result.bigend.vect[2]) {
              uVar11 = (uint)result.bigend.vect[2] >> 1;
            }
          }
          else if (result.bigend.vect[2] < 0) {
            uVar11 = ~(~result.bigend.vect[2] / iVar9);
          }
          else {
            uVar11 = result.bigend.vect[2] / iVar9;
          }
        }
      }
      else {
        clist.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        clist.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
        _M_node.super__List_node_base._M_prev._0_4_ = 0;
        for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
          if (((result.btype.itype >> ((uint)lVar20 & 0x1f) & 1) != 0) &&
             (result.bigend.vect[lVar20] % pIVar13->vect[lVar20] != 0)) {
            *(undefined4 *)
             ((long)&clist.lst.super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>
                     ._M_impl._M_node.super__List_node_base._M_next + lVar20 * 4) = 1;
          }
        }
        uVar10 = result.bigend.vect[0];
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            uVar10 = result.bigend.vect[0] >> 2;
            if (-1 < lVar22) {
              uVar10 = (uint)result.bigend.vect[0] >> 2;
            }
          }
          else if (iVar14 == 2) {
            uVar10 = result.bigend.vect[0] >> 1;
            if (-1 < lVar22) {
              uVar10 = (uint)result.bigend.vect[0] >> 1;
            }
          }
          else if (lVar22 < 0) {
            uVar10 = ~(~result.bigend.vect[0] / iVar14);
          }
          else {
            uVar10 = result.bigend.vect[0] / iVar14;
          }
        }
        uVar15 = result.bigend.vect[1];
        if (iVar12 != 1) {
          if (iVar12 == 4) {
            uVar15 = result.bigend.vect[1] >> 2;
            if (-1 < lVar23) {
              uVar15 = (uint)result.bigend.vect[1] >> 2;
            }
          }
          else if (iVar12 == 2) {
            uVar15 = result.bigend.vect[1] >> 1;
            if (-1 < lVar23) {
              uVar15 = (uint)result.bigend.vect[1] >> 1;
            }
          }
          else if (lVar23 < 0) {
            uVar15 = ~(~result.bigend.vect[1] / iVar12);
          }
          else {
            uVar15 = result.bigend.vect[1] / iVar12;
          }
        }
        uVar11 = result.bigend.vect[2];
        if (iVar9 != 1) {
          if (iVar9 == 4) {
            uVar11 = result.bigend.vect[2] >> 2;
            if (-1 < result.bigend.vect[2]) {
              uVar11 = (uint)result.bigend.vect[2] >> 2;
            }
          }
          else if (iVar9 == 2) {
            uVar11 = result.bigend.vect[2] >> 1;
            if (-1 < result.bigend.vect[2]) {
              uVar11 = (uint)result.bigend.vect[2] >> 1;
            }
          }
          else if (result.bigend.vect[2] < 0) {
            uVar11 = ~(~result.bigend.vect[2] / iVar9);
          }
          else {
            uVar11 = result.bigend.vect[2] / iVar9;
          }
        }
        uVar11 = uVar11 + (int)clist.lst.
                               super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>
                               ._M_impl._M_node.super__List_node_base._M_prev;
        result.bigend.vect[0] =
             uVar10 + (int)clist.lst.
                           super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
                           _M_impl._M_node.super__List_node_base._M_next;
        result.bigend.vect[1] =
             uVar15 + clist.lst.
                      super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
                      _M_node.super__List_node_base._M_next._4_4_;
      }
      result.bigend.vect[2] = uVar11;
    }
    *(ulong *)pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21].bigend.vect =
         CONCAT44(result.bigend.vect[1],result.bigend.vect[0]);
    *(undefined8 *)
     (pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar21].bigend.vect + 2) = result._20_8_;
    *(undefined8 *)
     pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
     _M_start[lVar21].smallend.vect = result.smallend.vect._0_8_;
    *(ulong *)(pc_domain.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start[lVar21].smallend.vect + 2) =
         CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
    lVar21 = lVar21 + 1;
    pIVar13 = pIVar13 + 1;
  } while( true );
}

Assistant:

void
AmrMesh::MakeNewGrids (int lbase, Real time, int& new_finest, Vector<BoxArray>& new_grids)
{
    BL_PROFILE("AmrMesh::MakeNewGrids()");

    BL_ASSERT(lbase < max_level);

    // Add at most one new level
    int max_crse = std::min(finest_level, max_level-1);

    if (new_grids.size() < max_crse+2) new_grids.resize(max_crse+2);

    //
    // Construct problem domain at each level.
    //
    Vector<IntVect> bf_lev(max_level); // Blocking factor at each level.
    Vector<IntVect> rr_lev(max_level);
    Vector<Box>     pc_domain(max_level);  // Coarsened problem domain.

    for (int i = 0; i <= max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bf_lev[i][n] = std::max(1,blocking_factor[i+1][n]/ref_ratio[i][n]);
        }
    }
    for (int i = lbase; i < max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            // Note that in AmrMesh we check that
            // ref ratio * coarse blocking factor >= fine blocking factor
            rr_lev[i][n] = (ref_ratio[i][n]*bf_lev[i][n])/bf_lev[i+1][n];
        }
    }
    for (int i = lbase; i <= max_crse; i++) {
        pc_domain[i] = amrex::coarsen(Geom(i).Domain(),bf_lev[i]);
    }
    //
    // Construct proper nesting domains.
    //
    Vector<BoxArray> p_n_ba(max_level); // Proper nesting domain.
    Vector<BoxArray> p_n_comp_ba(max_level); // Complement proper nesting domain.
    BoxList p_n, p_n_comp;

    BoxList bl = grids[lbase].simplified_list();
    bl.coarsen(bf_lev[lbase]);
    p_n_comp.parallelComplementIn(pc_domain[lbase],bl);
    bl.clear();
    p_n_comp.simplify();
    p_n_comp.accrete(n_proper);
    if (geom[lbase].isAnyPeriodic()) {
        ProjPeriodic(p_n_comp, pc_domain[lbase], geom[lbase].isPeriodic());
    }

    p_n_comp_ba[lbase].define(std::move(p_n_comp));
    p_n_comp = BoxList();

    p_n.parallelComplementIn(pc_domain[lbase],p_n_comp_ba[lbase]);
    p_n.simplify();

    p_n_ba[lbase].define(std::move(p_n));
    p_n = BoxList();

    for (int i = lbase+1; i <= max_crse; i++)
    {
        p_n_comp = p_n_comp_ba[i-1].boxList();

        // Need to simplify p_n_comp or the number of grids can too large for many levels.
        p_n_comp.simplify();

        p_n_comp.refine(rr_lev[i-1]);
        p_n_comp.accrete(n_proper);

        if (geom[i].isAnyPeriodic()) {
            ProjPeriodic(p_n_comp, pc_domain[i], geom[i].isPeriodic());
        }

        p_n_comp_ba[i].define(std::move(p_n_comp));
        p_n_comp = BoxList();

        p_n.parallelComplementIn(pc_domain[i],p_n_comp_ba[i]);
        p_n.simplify();

        p_n_ba[i].define(std::move(p_n));
        p_n = BoxList();
    }

    //
    // Now generate grids from finest level down.
    //
    new_finest = lbase;

    for (int levc = max_crse; levc >= lbase; levc--)
    {
        int levf = levc+1;
        //
        // Construct TagBoxArray with sufficient grow factor to contain
        // new levels projected down to this level.
        //
        IntVect ngt = n_error_buf[levc];
        BoxArray ba_proj;
        if (levf < new_finest)
        {
            ba_proj = new_grids[levf+1].simplified();
            ba_proj.coarsen(ref_ratio[levf]);
            ba_proj.growcoarsen(n_proper, ref_ratio[levc]);

            BoxArray levcBA = grids[levc].simplified();
            int ngrow = 0;
            while (!levcBA.contains(ba_proj))
            {
                levcBA.grow(1);
                ++ngrow;
            }
            ngt.max(IntVect(ngrow));
        }
        TagBoxArray tags(grids[levc],dmap[levc],ngt);

        //
        // Only use error estimation to tag cells for the creation of new grids
        //      if the grids at that level aren't already fixed.
        //

        if ( ! (useFixedCoarseGrids() && levc < useFixedUpToLevel()) ) {
            ErrorEst(levc, tags, time, 0);
        }

        //
        // Buffer error cells.
        //
        tags.buffer(n_error_buf[levc]);

        if (useFixedCoarseGrids())
        {
            if (levc>=useFixedUpToLevel())
            {
                tags.setVal(GetAreaNotToTag(levc), TagBox::CLEAR);
            }
            else
            {
                new_finest = std::max(new_finest,levf);
            }
        }

        //
        // Coarsen the taglist by blocking_factor/ref_ratio.
        //
        int bl_max = 0;
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bl_max = std::max(bl_max,bf_lev[levc][n]);
        }
        if (bl_max >= 1) {
            tags.coarsen(bf_lev[levc]);
        } else {
            amrex::Abort("blocking factor is too small relative to ref_ratio");
        }
        //
        // Remove or add tagged points which violate/satisfy additional
        // user-specified criteria.
        //
        ManualTagsPlacement(levc, tags, bf_lev);
        //
        // If new grids have been constructed above this level, project
        // those grids down and tag cells on intersections to ensure
        // proper nesting.
        //
        if (levf < new_finest) {
            ba_proj.coarsen(bf_lev[levc]);
            tags.setVal(ba_proj,TagBox::SET);
        }
        //
        // Map tagged points through periodic boundaries, if any.
        //
        tags.mapPeriodicRemoveDuplicates(Geometry(pc_domain[levc],
                                                  Geom(levc).ProbDomain(),
                                                  Geom(levc).CoordInt(),
                                                  Geom(levc).isPeriodic()));
        //
        // Remove cells outside proper nesting domain for this level.
        //
        tags.setVal(p_n_comp_ba[levc],TagBox::CLEAR);
        p_n_comp_ba[levc].clear();
        //
        // Create initial cluster containing all tagged points.
        //
        Gpu::PinnedVector<IntVect> tagvec;
        tags.collate(tagvec);
        tags.clear();

        if (tagvec.size() > 0)
        {
            //
            // Created new level, now generate efficient grids.
            //
            if ( !(useFixedCoarseGrids() && levc<useFixedUpToLevel()) ) {
                new_finest = std::max(new_finest,levf);
            }

            if (levf > useFixedUpToLevel()) {
                BoxList new_bx;
                if (ParallelDescriptor::IOProcessor()) {
                    BL_PROFILE("AmrMesh-cluster");
                    //
                    // Construct initial cluster.
                    //
                    ClusterList clist(&tagvec[0], tagvec.size());
                    if (use_new_chop) {
                        clist.new_chop(grid_eff);
                    } else {
                        clist.chop(grid_eff);
                    }
                    clist.intersect(p_n_ba[levc]);
                    //
                    // Efficient properly nested Clusters have been constructed
                    // now generate list of grids at level levf.
                    //
                    clist.boxList(new_bx);
                    new_bx.refine(bf_lev[levc]);
                    new_bx.simplify();

                    if (new_bx.size()>0) {
                        // Chop new grids outside domain
                        new_bx.intersect(Geom(levc).Domain());
                    }
                }
                new_bx.Bcast();  // Broadcast the new BoxList to other processes

                //
                // Refine up to levf.
                //
                new_bx.refine(ref_ratio[levc]);
                BL_ASSERT(new_bx.isDisjoint());

                new_grids[levf] = BoxArray(std::move(new_bx), max_grid_size[levf]);
            }
        }
    }

#if 0
    if (!useFixedCoarseGrids()) {
        // check proper nesting
        // This check does not consider periodic boundary and could fail if
        // the blocking factor is not the same on all levels.
        for (int lev = lbase+1; lev <= new_finest; ++lev) {
            BoxArray const& cba = (lev == lbase+1) ? grids[lev-1] : new_grids[lev-1];
            BoxArray const& fba = amrex::coarsen(new_grids[lev],ref_ratio[lev-1]);
            IntVect np = bf_lev[lev-1] * n_proper;
            Box const& cdomain = Geom(lev-1).Domain();
            for (int i = 0, N = fba.size(); i < N; ++i) {
                Box const& fb = amrex::grow(fba[i],np) & cdomain;
                if (!cba.contains(fb,true)) {
                    amrex::Abort("AmrMesh::MakeNewGrids: new grids not properly nested");
                }
            }
        }
    }
#endif

    for (int lev = lbase+1; lev <= new_finest; ++lev) {
        if (new_grids[lev].empty())
        {
            if (!(useFixedCoarseGrids() && lev<useFixedUpToLevel()) ) {
                amrex::Abort("AmrMesh::MakeNewGrids: how did this happen?");
            }
        }
        else if (refine_grid_layout)
        {
            ChopGrids(lev,new_grids[lev],ParallelDescriptor::NProcs());
            if (new_grids[lev] == grids[lev]) {
                new_grids[lev] = grids[lev]; // to avoid duplicates
            }
        }
    }
}